

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::PushTextureID(ImDrawList *this,ImTextureID texture_id)

{
  ImTextureID local_18;
  ImTextureID texture_id_local;
  ImDrawList *this_local;
  
  local_18 = texture_id;
  texture_id_local = this;
  ImVector<void_*>::push_back(&this->_TextureIdStack,&local_18);
  (this->_CmdHeader).TextureId = local_18;
  _OnChangedTextureID(this);
  return;
}

Assistant:

void ImDrawList::PushTextureID(ImTextureID texture_id)
{
    _TextureIdStack.push_back(texture_id);
    _CmdHeader.TextureId = texture_id;
    _OnChangedTextureID();
}